

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O1

Image * __thiscall
anon_unknown.dwarf_3f24d::ImageManager::operator()(ImageManager *this,Image *image)

{
  undefined4 in_ECX;
  void *in_R8;
  undefined **local_40;
  
  if (image->_type != this->_type) {
    _clone((ImageManager *)&stack0xffffffffffffffc0,(__fn *)this,image,
           CONCAT31((int3)((uint)in_ECX >> 8),image->_type),in_R8);
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
    ::emplace_back<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
                *)&this->_inputClone,(ImageTemplate<unsigned_char> *)&stack0xffffffffffffffc0);
    local_40 = &PTR__ImageTemplate_00219948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear
              ((ImageTemplate<unsigned_char> *)&stack0xffffffffffffffc0);
    image = (this->_inputClone).
            super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  return image;
}

Assistant:

const PenguinV_Image::Image & operator ()( const PenguinV_Image::Image & image )
        {
            if ( image.type() != _type ) {
                _inputClone.push_back( _clone( image ) );
                return _inputClone.back();
            }
            else {
                return image;
            }
        }